

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excitation_generation.cc
# Opt level: O3

void __thiscall
sptk::ExcitationGeneration::ExcitationGeneration
          (ExcitationGeneration *this,InputSourceInterpolationWithMagicNumber *input_source,
          RandomGenerationInterface *random_generation)

{
  int iVar1;
  
  this->_vptr_ExcitationGeneration = (_func_int **)&PTR__ExcitationGeneration_00111b78;
  this->input_source_ = input_source;
  this->random_generation_ = random_generation;
  this->is_valid_ = true;
  this->phase_ = 1.0;
  if ((input_source != (InputSourceInterpolationWithMagicNumber *)0x0) &&
     (iVar1 = (*(input_source->super_InputSourceInterface)._vptr_InputSourceInterface[3])
                        (input_source), (char)iVar1 != '\0')) {
    return;
  }
  this->is_valid_ = false;
  return;
}

Assistant:

ExcitationGeneration::ExcitationGeneration(
    InputSourceInterpolationWithMagicNumber* input_source,
    RandomGenerationInterface* random_generation)
    : input_source_(input_source),
      random_generation_(random_generation),
      is_valid_(true),
      phase_(1.0) {
  if (NULL == input_source_ || !input_source_->IsValid()) {
    is_valid_ = false;
    return;
  }
}